

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::resume_transform_feedback
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint32 dVar2;
  RenderContext *renderCtx;
  allocator<char> local_241;
  string local_240;
  char *local_220;
  char *tfVarying;
  deUint32 buf;
  allocator<char> local_1d9;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLuint tfID [2];
  NegativeTestContext *ctx_local;
  
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,puVar1,&local_1d9);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,puVar1,(allocator<char> *)((long)&tfVarying + 7));
  glu::makeVtxFragSources(&local_1b8,&local_1d8,(string *)&buf);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&buf);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tfVarying + 7));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  tfVarying._0_4_ = 0x1234;
  local_220 = "gl_Position";
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&tfVarying);
  glu::CallLogWrapper::glGenTransformFeedbacks
            (&ctx->super_CallLogWrapper,2,(GLuint *)&program.m_program.m_info.linkTimeUs);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar2);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,dVar2,1,&local_220,0x8c8c);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,dVar2);
  glu::CallLogWrapper::glBindTransformFeedback
            (&ctx->super_CallLogWrapper,0x8e22,(GLuint)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,(GLuint)tfVarying);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,0,(GLuint)tfVarying);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "GL_INVALID_OPERATION is generated if the currently bound transform feedback object is not active or is not paused."
             ,&local_241);
  NegativeTestContext::beginSection(ctx,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  glu::CallLogWrapper::glResumeTransformFeedback(&ctx->super_CallLogWrapper);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  glu::CallLogWrapper::glResumeTransformFeedback(&ctx->super_CallLogWrapper);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glPauseTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glResumeTransformFeedback(&ctx->super_CallLogWrapper);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&tfVarying);
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&ctx->super_CallLogWrapper,2,(GLuint *)&program.m_program.m_info.linkTimeUs);
  NegativeTestContext::expectError(ctx,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void resume_transform_feedback (NegativeTestContext& ctx)
{
	GLuint						tfID[2];
	glu::ShaderProgram			program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	deUint32					buf = 0x1234;
	const char* tfVarying		= "gl_Position";

	ctx.glGenBuffers				(1, &buf);
	ctx.glGenTransformFeedbacks		(2, tfID);

	ctx.glUseProgram				(program.getProgram());
	ctx.glTransformFeedbackVaryings	(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram				(program.getProgram());
	ctx.glBindTransformFeedback		(GL_TRANSFORM_FEEDBACK, tfID[0]);
	ctx.glBindBuffer				(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData				(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.expectError					(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_OPERATION is generated if the currently bound transform feedback object is not active or is not paused.");
	ctx.glResumeTransformFeedback	();
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.glResumeTransformFeedback	();
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glPauseTransformFeedback	();
	ctx.glResumeTransformFeedback	();
	ctx.expectError					(GL_NO_ERROR);
	ctx.endSection();

	ctx.glEndTransformFeedback		();
	ctx.glDeleteBuffers				(1, &buf);
	ctx.glDeleteTransformFeedbacks	(2, tfID);
	ctx.expectError					(GL_NO_ERROR);
}